

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovQueue.cpp
# Opt level: O0

cl_command_queue
cov::createCommandQueue
          (cl_context context,cl_device_id device,cl_command_queue_properties properties,
          cl_int *errcodeRet)

{
  bool bVar1;
  Countable<cov::Queue> *this;
  Countable<cov::Queue> *local_80;
  Queue *q;
  Countable<cov::Queue> *queue;
  bool enableProfiling;
  Device *pDStack_40;
  bool isOutOfOrder;
  Device *d;
  Context *c;
  cl_int *errcodeRet_local;
  cl_command_queue_properties properties_local;
  cl_device_id device_local;
  cl_context context_local;
  
  pDStack_40 = (Device *)device;
  d = (Device *)context;
  c = (Context *)errcodeRet;
  errcodeRet_local = (cl_int *)properties;
  properties_local = (cl_command_queue_properties)device;
  device_local = (cl_device_id)context;
  bVar1 = Context::hasDevice((Context *)context,(Device *)device);
  if (bVar1) {
    queue._7_1_ = errcodeRet_local != (cl_int *)0x1;
    queue._6_1_ = errcodeRet_local == (cl_int *)0x2;
    this = (Countable<cov::Queue> *)operator_new(0x38,(nothrow_t *)&std::nothrow);
    local_80 = (Countable<cov::Queue> *)0x0;
    if (this != (Countable<cov::Queue> *)0x0) {
      Countable<cov::Queue>::Countable<cov::Context,cov::Device,bool,bool>
                (this,(Context *)d,pDStack_40,(bool *)((long)&queue + 7),(bool *)((long)&queue + 6))
      ;
      local_80 = this;
    }
    if (local_80 == (Countable<cov::Queue> *)0x0) {
      *(undefined4 *)&(c->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_icdTable =
           0xfffffffa;
      context_local = (cl_context)0x0;
    }
    else {
      bVar1 = ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6>::initSuccess
                        ((ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6> *)local_80);
      if (bVar1) {
        *(undefined4 *)&(c->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_icdTable = 0;
        context_local = (cl_context)local_80;
      }
      else {
        ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6>::release
                  ((ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6> *)local_80);
        *(undefined4 *)&(c->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_icdTable =
             0xfffffffb;
        context_local = (cl_context)0x0;
      }
    }
  }
  else {
    *(undefined4 *)&(c->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_icdTable =
         0xffffffdf;
    context_local = (cl_context)0x0;
  }
  return (cl_command_queue)context_local;
}

Assistant:

cl_command_queue createCommandQueue(cl_context context,
                                    cl_device_id device,
                                    cl_command_queue_properties properties,
                                    cl_int* errcodeRet)
{
    auto c = reinterpret_cast<Context*>(context);
    auto d = reinterpret_cast<Device*>(device);
    if (!c->hasDevice(d)) {
        *errcodeRet = CL_INVALID_DEVICE;
        return nullptr;
    }

    bool isOutOfOrder = properties != CL_QUEUE_OUT_OF_ORDER_EXEC_MODE_ENABLE;
    bool enableProfiling = properties == CL_QUEUE_PROFILING_ENABLE;
    auto queue = new(std::nothrow) Countable<Queue>(*c, *d, isOutOfOrder, enableProfiling);
    if (!queue) {
        *errcodeRet = CL_OUT_OF_HOST_MEMORY;
        return nullptr;
    }

    auto q = reinterpret_cast<Queue*>(queue);
    if (!q->initSuccess()) {
        q->release();
        *errcodeRet = CL_OUT_OF_RESOURCES;
        return nullptr;
    }

    *errcodeRet = CL_SUCCESS;
    return reinterpret_cast<_cl_command_queue*>(q);
}